

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O0

float imageio::convertSFloatToFloat(uint32_t rawBits,uint32_t numBits)

{
  int in_ESI;
  uint16_t in_DI;
  uint local_8;
  float local_4;
  
  if (in_ESI != 0x10 && in_ESI != 0x20) {
    __assert_fail("numBits == 16 || numBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                  ,0xad,"float imageio::convertSFloatToFloat(uint32_t, uint32_t)");
  }
  if (in_ESI == 0x10) {
    local_4 = half_to_float(in_DI);
  }
  else if (in_ESI == 0x20) {
    local_4 = bit_cast<float,unsigned_int>(&local_8);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

[[nodiscard]] inline float convertSFloatToFloat(uint32_t rawBits, uint32_t numBits) {
    assert(numBits == 16 || numBits == 32);
    if (numBits == 16)
        return half_to_float(static_cast<uint16_t>(rawBits));
    if (numBits == 32)
        return bit_cast<float>(rawBits);
    return 0;
}